

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O3

void __thiscall
QHttpNetworkRequest::prependHeaderField(QHttpNetworkRequest *this,QByteArray *name,QByteArray *data)

{
  QHttpNetworkRequestPrivate *this_00;
  
  this_00 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(this_00->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(&this->d);
    this_00 = (this->d).d.ptr;
  }
  QHttpNetworkHeaderPrivate::prependHeaderField(&this_00->super_QHttpNetworkHeaderPrivate,name,data)
  ;
  return;
}

Assistant:

void QHttpNetworkRequest::prependHeaderField(const QByteArray &name, const QByteArray &data)
{
    d->prependHeaderField(name, data);
}